

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_itext(LodePNGInfo *info,char *key,char *langtag,char *transkey,char *str)

{
  void *pvVar1;
  char **out;
  char *in;
  void *pvVar2;
  long in_RDI;
  char **new_strings;
  char **new_transkeys;
  char **new_langtags;
  char **new_keys;
  size_t in_stack_ffffffffffffffa8;
  void *in_stack_ffffffffffffffb0;
  undefined4 local_4;
  
  pvVar1 = lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  out = (char **)lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  in = (char *)lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  pvVar2 = lodepng_realloc(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if ((((pvVar1 == (void *)0x0) || (out == (char **)0x0)) || (in == (char *)0x0)) ||
     (pvVar2 == (void *)0x0)) {
    lodepng_free((void *)0x5d755a);
    lodepng_free((void *)0x5d7564);
    lodepng_free((void *)0x5d756e);
    lodepng_free((void *)0x5d7578);
    local_4 = 0x53;
  }
  else {
    *(long *)(in_RDI + 0x60) = *(long *)(in_RDI + 0x60) + 1;
    *(void **)(in_RDI + 0x68) = pvVar1;
    *(char ***)(in_RDI + 0x70) = out;
    *(char **)(in_RDI + 0x78) = in;
    *(void **)(in_RDI + 0x80) = pvVar2;
    string_init((char **)0x5d75f3);
    string_set(out,in);
    string_init((char **)0x5d763c);
    string_set(out,in);
    string_init((char **)0x5d7685);
    string_set(out,in);
    string_init((char **)0x5d76d1);
    string_set(out,in);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

unsigned lodepng_add_itext(LodePNGInfo* info, const char* key, const char* langtag,
                           const char* transkey, const char* str)
{
  char** new_keys = (char**)(lodepng_realloc(info->itext_keys, sizeof(char*) * (info->itext_num + 1)));
  char** new_langtags = (char**)(lodepng_realloc(info->itext_langtags, sizeof(char*) * (info->itext_num + 1)));
  char** new_transkeys = (char**)(lodepng_realloc(info->itext_transkeys, sizeof(char*) * (info->itext_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->itext_strings, sizeof(char*) * (info->itext_num + 1)));
  if(!new_keys || !new_langtags || !new_transkeys || !new_strings)
  {
    lodepng_free(new_keys);
    lodepng_free(new_langtags);
    lodepng_free(new_transkeys);
    lodepng_free(new_strings);
    return 83; /*alloc fail*/
  }

  ++info->itext_num;
  info->itext_keys = new_keys;
  info->itext_langtags = new_langtags;
  info->itext_transkeys = new_transkeys;
  info->itext_strings = new_strings;

  string_init(&info->itext_keys[info->itext_num - 1]);
  string_set(&info->itext_keys[info->itext_num - 1], key);

  string_init(&info->itext_langtags[info->itext_num - 1]);
  string_set(&info->itext_langtags[info->itext_num - 1], langtag);

  string_init(&info->itext_transkeys[info->itext_num - 1]);
  string_set(&info->itext_transkeys[info->itext_num - 1], transkey);

  string_init(&info->itext_strings[info->itext_num - 1]);
  string_set(&info->itext_strings[info->itext_num - 1], str);

  return 0;
}